

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::CheckCMP0037(cmMakefile *this,string *targetName,TargetType targetType)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  MessageType t;
  string sStack_1b8;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar1 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0037,false);
  if (PVar1 - NEW < 3) {
    t = FATAL_ERROR;
    bVar3 = true;
LAB_003484bc:
    poVar2 = std::operator<<((ostream *)&e,"The target name \"");
    poVar2 = std::operator<<(poVar2,(string *)targetName);
    std::operator<<(poVar2,
                    "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                   );
    std::__cxx11::stringbuf::str();
    IssueMessage(this,t,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    if (bVar3) {
      bVar3 = false;
      goto LAB_0034851e;
    }
  }
  else if ((PVar1 == WARN) && (targetType != INTERFACE_LIBRARY)) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1b8,(cmPolicies *)0x25,id);
    poVar2 = std::operator<<((ostream *)&e,(string *)&sStack_1b8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&sStack_1b8);
    bVar3 = false;
    t = AUTHOR_WARNING;
    goto LAB_003484bc;
  }
  bVar3 = true;
LAB_0034851e:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return bVar3;
}

Assistant:

bool cmMakefile::CheckCMP0037(std::string const& targetName,
                              cmStateEnums::TargetType targetType) const
{
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (this->GetPolicyStatus(cmPolicies::CMP0037)) {
    case cmPolicies::WARN:
      if (targetType != cmStateEnums::INTERFACE_LIBRARY) {
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName
      << "\" is reserved or not valid for certain "
         "CMake features, such as generator expressions, and may result "
         "in undefined behavior.";
    this->IssueMessage(messageType, e.str());

    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}